

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

int wally_hex_n_verify(char *hex,size_t hex_len)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  iVar1 = -2;
  if ((hex_len & 1) == 0 && (hex_len != 0 && hex != (char *)0x0)) {
    sVar2 = 0;
    do {
      if (9 < (byte)(hex[sVar2] - 0x30U)) {
        uVar3 = (byte)hex[sVar2] - 0x41;
        if (0x25 < uVar3) {
          return -2;
        }
        if ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return -2;
        }
      }
      sVar2 = sVar2 + 1;
    } while (hex_len != sVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_hex_n_verify(const char *hex, size_t hex_len)
{
    if (!hex || !hex_len || hex_len & 0x1)
        return WALLY_EINVAL;

    while (hex_len--) {
        char c = *hex++;
        if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}